

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

bool cmCacheManager::ParseEntry(string *entry,string *var,string *value,CacheEntryType *type)

{
  char *pcVar1;
  bool bVar2;
  CacheEntryType CVar3;
  int iVar4;
  RegularExpression *this;
  string local_50;
  
  if ((ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
       ::reg == '\0') &&
     (iVar4 = __cxa_guard_acquire(&ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                                   ::reg), iVar4 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseEntry::reg,"^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseEntry::reg,&__dso_handle);
    __cxa_guard_release(&ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                         ::reg);
  }
  if ((ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
       ::regQuoted == '\0') &&
     (iVar4 = __cxa_guard_acquire(&ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                                   ::regQuoted), iVar4 != 0)) {
    cmsys::RegularExpression::RegularExpression
              (&ParseEntry::regQuoted,"^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&ParseEntry::regQuoted,&__dso_handle);
    __cxa_guard_release(&ParseEntry(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,cmState::CacheEntryType&)
                         ::regQuoted);
  }
  bVar2 = cmsys::RegularExpression::find(&ParseEntry::regQuoted,entry);
  if (bVar2) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_50,&ParseEntry::regQuoted,1);
    std::__cxx11::string::operator=((string *)var,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    cmsys::RegularExpression::match_abi_cxx11_(&local_50,&ParseEntry::regQuoted,2);
    CVar3 = cmState::StringToCacheEntryType(local_50._M_dataplus._M_p);
    *type = CVar3;
    std::__cxx11::string::~string((string *)&local_50);
    this = &ParseEntry::regQuoted;
  }
  else {
    bVar2 = cmsys::RegularExpression::find(&ParseEntry::reg,entry);
    if (!bVar2) {
      if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
           ::reg == '\0') &&
         (iVar4 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                       ::reg), iVar4 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  ((RegularExpression *)
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::reg,"^([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                     ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                     ::reg,&__dso_handle);
        __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                             ::reg);
      }
      if ((ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
           ::regQuoted == '\0') &&
         (iVar4 = __cxa_guard_acquire(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                                       ::regQuoted), iVar4 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  ((RegularExpression *)
                   ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                   ::regQuoted,"^\"([^\"]*)\"=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                     ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                     ::regQuoted,&__dso_handle);
        __cxa_guard_release(&ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                             ::regQuoted);
      }
      bVar2 = cmsys::RegularExpression::find
                        ((RegularExpression *)
                         ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                         ::regQuoted,entry);
      if (bVar2) {
        this = (RegularExpression *)
               ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
               ::regQuoted;
      }
      else {
        bVar2 = cmsys::RegularExpression::find
                          ((RegularExpression *)
                           ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
                           ::reg,entry);
        if (!bVar2) {
          return false;
        }
        this = (RegularExpression *)
               ParseEntryWithoutType(std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&)
               ::reg;
      }
      cmsys::RegularExpression::match_abi_cxx11_(&local_50,this,1);
      std::__cxx11::string::operator=((string *)var,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      iVar4 = 2;
      goto LAB_00334f64;
    }
    cmsys::RegularExpression::match_abi_cxx11_(&local_50,&ParseEntry::reg,1);
    std::__cxx11::string::operator=((string *)var,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    cmsys::RegularExpression::match_abi_cxx11_(&local_50,&ParseEntry::reg,2);
    CVar3 = cmState::StringToCacheEntryType(local_50._M_dataplus._M_p);
    *type = CVar3;
    std::__cxx11::string::~string((string *)&local_50);
    this = &ParseEntry::reg;
  }
  iVar4 = 3;
LAB_00334f64:
  cmsys::RegularExpression::match_abi_cxx11_(&local_50,this,iVar4);
  std::__cxx11::string::operator=((string *)value,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (((1 < value->_M_string_length) && (pcVar1 = (value->_M_dataplus)._M_p, *pcVar1 == '\'')) &&
     (pcVar1[value->_M_string_length - 1] == '\'')) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)value);
    std::__cxx11::string::operator=((string *)value,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return true;
}

Assistant:

bool cmCacheManager::ParseEntry(const std::string& entry,
                                std::string& var,
                                std::string& value,
                                cmState::CacheEntryType& type)
{
  // input line is:         key:type=value
  static cmsys::RegularExpression reg(
    "^([^=:]*):([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  // input line is:         "key":type=value
  static cmsys::RegularExpression regQuoted(
    "^\"([^\"]*)\":([^=]*)=(.*[^\r\t ]|[\r\t ]*)[\r\t ]*$");
  bool flag = false;
  if(regQuoted.find(entry))
    {
    var = regQuoted.match(1);
    type = cmState::StringToCacheEntryType(regQuoted.match(2).c_str());
    value = regQuoted.match(3);
    flag = true;
    }
  else if (reg.find(entry))
    {
    var = reg.match(1);
    type = cmState::StringToCacheEntryType(reg.match(2).c_str());
    value = reg.match(3);
    flag = true;
    }

  // if value is enclosed in single quotes ('foo') then remove them
  // it is used to enclose trailing space or tab
  if (flag &&
      value.size() >= 2 &&
      value[0] == '\'' &&
      value[value.size() - 1] == '\'')
    {
    value = value.substr(1,
                         value.size() - 2);
    }

  if (!flag)
    {
    return ParseEntryWithoutType(entry, var, value);
    }

  return flag;
}